

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objtracker.cpp
# Opt level: O0

void __thiscall CObjectTracker::writeReport(CObjectTracker *this,ostream *os)

{
  void *in_RSI;
  ostream *in_RDI;
  allocator *os_00;
  CPointerTracker *tracker;
  allocator *label;
  CTracker *tracker_00;
  string *in_stack_fffffffffffffe28;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  undefined1 local_91 [40];
  allocator local_69;
  string local_68 [55];
  undefined1 local_31 [49];
  
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  tracker_00 = (CTracker *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"cl_device_id",(allocator *)tracker_00);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  label = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"cl_context",label);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  tracker = (CPointerTracker *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),"cl_command_queue",(allocator *)tracker);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  os_00 = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"cl_mem",os_00);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"cl_sampler",&local_e1);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"cl_program",&local_109);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"cl_kernel",&local_131);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"cl_event",&local_159);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"cl_semaphore_khr",&local_181);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"cl_command_buffer_khr",&local_1a9);
  ReportHelper(in_stack_fffffffffffffe28,tracker_00,in_RDI);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"SVM/USM allocation",(allocator *)&stack0xfffffffffffffe2f)
  ;
  ReportHelper((string *)label,tracker,(ostream *)os_00);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe2f);
  return;
}

Assistant:

void CObjectTracker::writeReport( std::ostream& os )
{
    os << std::endl;
    ReportHelper( "cl_device_id",       m_Devices,          os );
    ReportHelper( "cl_context",         m_Contexts,         os );
    ReportHelper( "cl_command_queue",   m_CommandQueues,    os );
    ReportHelper( "cl_mem",             m_MemObjects,       os );
    ReportHelper( "cl_sampler",         m_Samplers,         os );
    ReportHelper( "cl_program",         m_Programs,         os );
    ReportHelper( "cl_kernel",          m_Kernels,          os );
    ReportHelper( "cl_event",           m_Events,           os );
    ReportHelper( "cl_semaphore_khr",   m_Semaphores,       os );
    ReportHelper( "cl_command_buffer_khr", m_CommandBuffers, os );
    ReportHelper( "SVM/USM allocation", m_Pointers,         os );
}